

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall
wasm::OptimizeInstructions::visitMemoryCopy(OptimizeInstructions *this,MemoryCopy *curr)

{
  bool bVar1;
  Module *pMVar2;
  Expression *rep;
  Expression *ret;
  MemoryCopy *local_18;
  MemoryCopy *curr_local;
  OptimizeInstructions *this_local;
  
  ret._4_4_ = 1;
  local_18 = curr;
  curr_local = (MemoryCopy *)this;
  bVar1 = wasm::Type::operator==
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)38>).super_Expression.
                      type,(BasicType *)((long)&ret + 4));
  if (!bVar1) {
    pMVar2 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                        ).
                        super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                        .
                        super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      );
    bVar1 = FeatureSet::hasBulkMemoryOpt(&pMVar2->features);
    if (!bVar1) {
      __assert_fail("getModule()->features.hasBulkMemoryOpt()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                    ,0x51a,"void wasm::OptimizeInstructions::visitMemoryCopy(MemoryCopy *)");
    }
    rep = optimizeMemoryCopy(this,local_18);
    if (rep != (Expression *)0x0) {
      replaceCurrent(this,rep);
    }
  }
  return;
}

Assistant:

void visitMemoryCopy(MemoryCopy* curr) {
    if (curr->type == Type::unreachable) {
      return;
    }
    assert(getModule()->features.hasBulkMemoryOpt());
    if (auto* ret = optimizeMemoryCopy(curr)) {
      return replaceCurrent(ret);
    }
  }